

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

_Bool mpack_tree_reserve_bytes(mpack_tree_parser_t *parser,size_t bytes)

{
  size_t bytes_local;
  mpack_tree_parser_t *parser_local;
  
  if (parser->possible_nodes_left < bytes) {
    parser_local._7_1_ = mpack_tree_reserve_fill(parser,bytes);
  }
  else {
    parser->possible_nodes_left = parser->possible_nodes_left - bytes;
    parser_local._7_1_ = true;
  }
  return parser_local._7_1_;
}

Assistant:

MPACK_STATIC_INLINE bool mpack_tree_reserve_bytes(mpack_tree_parser_t* parser, size_t bytes) {
    if (bytes <= parser->possible_nodes_left) {
        parser->possible_nodes_left -= bytes;
        return true;
    }

    #ifdef MPACK_MALLOC
    return mpack_tree_reserve_fill(parser, bytes);
    #else
    mpack_tree_flag_error(parser->tree, mpack_error_invalid);
    return false;
    #endif
}